

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_NtkDfs_iter(Vec_Ptr_t *vStack,Abc_Obj_t *pRoot,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  int iFanin;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pRoot_local;
  Vec_Ptr_t *vStack_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pRoot);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pRoot);
    iVar1 = Abc_ObjIsCi(pRoot);
    if ((iVar1 == 0) &&
       ((iVar1 = Abc_NtkIsStrash(pRoot->pNtk), iVar1 == 0 ||
        (iVar1 = Abc_AigNodeIsConst(pRoot), iVar1 == 0)))) {
      Vec_PtrClear(vStack);
      Vec_PtrPush(vStack,pRoot);
      Vec_PtrPush(vStack,(void *)0x0);
      while (iVar1 = Vec_PtrSize(vStack), 0 < iVar1) {
        pvVar3 = Vec_PtrPop(vStack);
        iVar1 = (int)pvVar3;
        pAVar4 = (Abc_Obj_t *)Vec_PtrPop(vStack);
        iVar2 = Abc_ObjIsNet(pAVar4);
        if (iVar2 != 0) {
          __assert_fail("!Abc_ObjIsNet(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                        ,0x218,"void Abc_NtkDfs_iter(Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)");
        }
        iVar2 = Abc_ObjFaninNum(pAVar4);
        if (iVar1 == iVar2) {
          Vec_PtrPush(vNodes,pAVar4);
        }
        else {
          Vec_PtrPush(vStack,pAVar4);
          Vec_PtrPush(vStack,(void *)(long)(iVar1 + 1));
          pAVar4 = Abc_ObjFanin(pAVar4,iVar1);
          pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
          iVar1 = Abc_NodeIsTravIdCurrent(pAVar4);
          if (iVar1 == 0) {
            Abc_NodeSetTravIdCurrent(pAVar4);
            iVar1 = Abc_ObjIsCi(pAVar4);
            if ((iVar1 == 0) &&
               ((iVar1 = Abc_NtkIsStrash(pAVar4->pNtk), iVar1 == 0 ||
                (iVar1 = Abc_AigNodeIsConst(pAVar4), iVar1 == 0)))) {
              Vec_PtrPush(vStack,pAVar4);
              Vec_PtrPush(vStack,(void *)0x0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkDfs_iter( Vec_Ptr_t * vStack, Abc_Obj_t * pRoot, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode, * pFanin;
    int iFanin;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pRoot ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pRoot );
    // skip the CI
    if ( Abc_ObjIsCi(pRoot) || (Abc_NtkIsStrash(pRoot->pNtk) && Abc_AigNodeIsConst(pRoot)) )
        return;
    // add the CI
    Vec_PtrClear( vStack );
    Vec_PtrPush( vStack, pRoot );
    Vec_PtrPush( vStack, (void *)0 );
    while ( Vec_PtrSize(vStack) > 0 )
    {
        // get the node and its fanin
        iFanin = (int)(ABC_PTRINT_T)Vec_PtrPop(vStack);
        pNode  = (Abc_Obj_t *)Vec_PtrPop(vStack);
        assert( !Abc_ObjIsNet(pNode) );
        // add it to the array of nodes if we finished
        if ( iFanin == Abc_ObjFaninNum(pNode) )
        {
            Vec_PtrPush( vNodes, pNode );
            continue;
        }
        // explore the next fanin
        Vec_PtrPush( vStack, pNode );
        Vec_PtrPush( vStack, (void *)(ABC_PTRINT_T)(iFanin+1) );
        // get the fanin
        pFanin = Abc_ObjFanin0Ntk( Abc_ObjFanin(pNode,iFanin) );
        // if this node is already visited, skip
        if ( Abc_NodeIsTravIdCurrent( pFanin ) )
            continue;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pFanin );
        // skip the CI
        if ( Abc_ObjIsCi(pFanin) || (Abc_NtkIsStrash(pFanin->pNtk) && Abc_AigNodeIsConst(pFanin)) )
            continue;
        Vec_PtrPush( vStack, pFanin );
        Vec_PtrPush( vStack, (void *)0 );   
    }
}